

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall TPZMatrix<int>::Simetrize(TPZMatrix<int> *this)

{
  undefined4 uVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  long lVar6;
  long lVar7;
  
  lVar5 = (this->super_TPZBaseMatrix).fRow;
  if (lVar5 != (this->super_TPZBaseMatrix).fCol) {
    Error("Simetrize only work for square matrices",(char *)0x0);
    lVar5 = (this->super_TPZBaseMatrix).fRow;
  }
  lVar2 = 0;
  lVar4 = 0;
  if (0 < lVar5) {
    lVar4 = lVar5;
  }
  while (lVar6 = lVar2, lVar6 != lVar4) {
    for (lVar7 = lVar6 + 1; lVar2 = lVar6 + 1, lVar7 < lVar5; lVar7 = lVar7 + 1) {
      iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,lVar6,lVar7);
      uVar1 = *(undefined4 *)CONCAT44(extraout_var,iVar3);
      iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,lVar7,lVar6);
      *(undefined4 *)CONCAT44(extraout_var_00,iVar3) = uVar1;
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Simetrize() {
  
  if ( Rows() != Cols() ) {
    Error( "Simetrize only work for square matrices" );
  }
  
  int64_t row,col;
  int64_t fDim1 = Rows();
  for(row=0; row<fDim1; row++) {
    for(col=row+1; col<fDim1; col++) {
      this->s(col,row) = this->s(row,col);
    }
  }
  
}